

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

int Ver_ParseFormalNetsAreDriven(Abc_Ntk_t *pNtk,char *pNameFormal)

{
  int iVar1;
  void *pvVar2;
  undefined8 *puVar3;
  int i;
  Vec_Ptr_t *p;
  int i_00;
  
  puVar3 = (undefined8 *)0x0;
  i = 0;
  do {
    if (((Vec_Ptr_t *)pNtk->pData)->nSize <= i) {
      return 0;
    }
    pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)pNtk->pData,i);
    p = *(Vec_Ptr_t **)((long)pvVar2 + 0x40);
    iVar1 = p->nSize;
    while (i_00 = iVar1 + -1, 0 < iVar1) {
      puVar3 = (undefined8 *)Vec_PtrEntry(p,i_00);
      if ((puVar3 != (undefined8 *)0x0) && (iVar1 = strcmp((char *)*puVar3,pNameFormal), iVar1 == 0)
         ) {
        p = *(Vec_Ptr_t **)((long)pvVar2 + 0x40);
        break;
      }
      p = *(Vec_Ptr_t **)((long)pvVar2 + 0x40);
      iVar1 = i_00;
    }
    if (p->nSize != i_00) {
      if (puVar3 == (undefined8 *)0x0) {
        __assert_fail("pBundle",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verCore.c"
                      ,0x9bc,"int Ver_ParseFormalNetsAreDriven(Abc_Ntk_t *, char *)");
      }
      iVar1 = 0;
      while (iVar1 < ((Vec_Ptr_t *)puVar3[1])->nSize) {
        pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)puVar3[1],iVar1);
        iVar1 = iVar1 + 1;
        if (0 < *(int *)((long)pvVar2 + 0x1c)) {
          return 1;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Ver_ParseFormalNetsAreDriven( Abc_Ntk_t * pNtk, char * pNameFormal )
{
    Ver_Bundle_t * pBundle = NULL;
    Abc_Obj_t * pBox, * pNet;
    int k, j, m;
    // go through instances of this type
    Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
    {
        // find a bundle with the given name in this instance
        Vec_PtrForEachEntryReverse( Ver_Bundle_t *, (Vec_Ptr_t *)pBox->pCopy, pBundle, j )
            if ( pBundle && !strcmp( pBundle->pNameFormal, pNameFormal ) )
                break;
        // skip non-driven bundles
        if ( j == Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) )
            continue;
        // check if all nets are driven in this bundle
        assert(pBundle); // Verify that pBundle was assigned to.
        Vec_PtrForEachEntry( Abc_Obj_t *, pBundle->vNetsActual, pNet, m )
            if ( Abc_ObjFaninNum(pNet) > 0 )
                return 1;
    }
    return 0;
}